

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_generic.c
# Opt level: O2

_Bool tirpc_control(u_int rq,void *in)

{
  undefined8 uVar1;
  mem_char_t p_Var2;
  mem_format_t p_Var3;
  mem_free_size_t p_Var4;
  mem_1_size_t p_Var5;
  mem_2_size_t p_Var6;
  mem_p_size_t p_Var7;
  uint32_t uVar8;
  
  p_Var7 = __ntirpc_pkg_params.realloc_;
  p_Var6 = __ntirpc_pkg_params.aligned_;
  p_Var5 = __ntirpc_pkg_params.malloc_;
  p_Var4 = __ntirpc_pkg_params.free_size_;
  p_Var3 = __ntirpc_pkg_params.warnx_;
  p_Var2 = __ntirpc_pkg_params.thread_name_;
  uVar1 = __ntirpc_pkg_params._0_8_;
  switch(rq) {
  case 0:
    *(mem_2_size_t *)((long)in + 0x30) = __ntirpc_pkg_params.calloc_;
    *(mem_p_size_t *)((long)in + 0x38) = p_Var7;
    *(mem_1_size_t *)((long)in + 0x20) = p_Var5;
    *(mem_2_size_t *)((long)in + 0x28) = p_Var6;
    *(mem_format_t *)((long)in + 0x10) = p_Var3;
    *(mem_free_size_t *)((long)in + 0x18) = p_Var4;
    *(undefined8 *)in = uVar1;
    *(mem_char_t *)((long)in + 8) = p_Var2;
    break;
  case 1:
    __ntirpc_pkg_params._0_8_ = *in;
    __ntirpc_pkg_params.thread_name_ = *(mem_char_t *)((long)in + 8);
    __ntirpc_pkg_params.warnx_ = *(mem_format_t *)((long)in + 0x10);
    __ntirpc_pkg_params.free_size_ = *(mem_free_size_t *)((long)in + 0x18);
    __ntirpc_pkg_params.malloc_ = *(mem_1_size_t *)((long)in + 0x20);
    __ntirpc_pkg_params.aligned_ = *(mem_2_size_t *)((long)in + 0x28);
    __ntirpc_pkg_params.calloc_ = *(mem_2_size_t *)((long)in + 0x30);
    __ntirpc_pkg_params.realloc_ = *(mem_p_size_t *)((long)in + 0x38);
    break;
  case 2:
    uVar8 = __ntirpc_pkg_params.debug_flags;
    goto LAB_00110b70;
  case 3:
    __ntirpc_pkg_params.debug_flags = *in;
    break;
  case 4:
    uVar8 = __ntirpc_pkg_params.other_flags;
LAB_00110b70:
    *(uint32_t *)in = uVar8;
    break;
  case 5:
    __ntirpc_pkg_params.other_flags = *in;
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool
tirpc_control(const u_int rq, void *in)
{
	switch (rq) {
	case TIRPC_GET_PARAMETERS:
		*(tirpc_pkg_params *)in = __ntirpc_pkg_params;
		break;
	case TIRPC_PUT_PARAMETERS:
		__ntirpc_pkg_params = *(tirpc_pkg_params *)in;
		break;
	case TIRPC_GET_DEBUG_FLAGS:
		*(u_int *) in = __ntirpc_pkg_params.debug_flags;
		break;
	case TIRPC_SET_DEBUG_FLAGS:
		__ntirpc_pkg_params.debug_flags = *(int *)in;
		break;
	case TIRPC_GET_OTHER_FLAGS:
		*(u_int *) in = __ntirpc_pkg_params.other_flags;
		break;
	case TIRPC_SET_OTHER_FLAGS:
		__ntirpc_pkg_params.other_flags = *(int *)in;
		break;
	default:
		return (false);
	}
	return (true);
}